

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::TargetProgress::WriteProgressVariables
          (TargetProgress *this,unsigned_long total,unsigned_long *current)

{
  char *name;
  ostream *poVar1;
  ulong local_290;
  unsigned_long num_1;
  unsigned_long num;
  ulong local_270;
  unsigned_long i;
  cmGeneratedFileStream fout;
  unsigned_long *current_local;
  unsigned_long total_local;
  TargetProgress *this_local;
  
  fout._576_8_ = current;
  name = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&i,name,false,None);
  for (local_270 = 1; local_270 <= this->NumberOfActions; local_270 = local_270 + 1) {
    poVar1 = std::operator<<((ostream *)&i,"CMAKE_PROGRESS_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_270);
    std::operator<<(poVar1," = ");
    if (total < 0x65) {
      num_1 = local_270 + *(long *)fout._576_8_;
      std::ostream::operator<<(&i,num_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->Marks,&num_1);
    }
    else if ((((local_270 - 1) + *(long *)fout._576_8_) * 100) / total <
             ((local_270 + *(long *)fout._576_8_) * 100) / total) {
      local_290 = ((local_270 + *(long *)fout._576_8_) * 100) / total;
      std::ostream::operator<<(&i,local_290);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->Marks,&local_290)
      ;
    }
    std::operator<<((ostream *)&i,"\n");
  }
  std::operator<<((ostream *)&i,"\n");
  *(unsigned_long *)fout._576_8_ = this->NumberOfActions + *(long *)fout._576_8_;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&i);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::TargetProgress::WriteProgressVariables(
  unsigned long total, unsigned long& current)
{
  cmGeneratedFileStream fout(this->VariableFile.c_str());
  for (unsigned long i = 1; i <= this->NumberOfActions; ++i) {
    fout << "CMAKE_PROGRESS_" << i << " = ";
    if (total <= 100) {
      unsigned long num = i + current;
      fout << num;
      this->Marks.push_back(num);
    } else if (((i + current) * 100) / total >
               ((i - 1 + current) * 100) / total) {
      unsigned long num = ((i + current) * 100) / total;
      fout << num;
      this->Marks.push_back(num);
    }
    fout << "\n";
  }
  fout << "\n";
  current += this->NumberOfActions;
}